

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void attach_egg_hatch_timeout(obj *egg)

{
  int iVar1;
  int local_14;
  int i;
  obj *egg_local;
  
  stop_timer(egg->olev,4,egg);
  local_14 = 0x97;
  while( true ) {
    if (200 < local_14) {
      return;
    }
    iVar1 = rnd(local_14);
    if (0x96 < iVar1) break;
    local_14 = local_14 + 1;
  }
  start_timer(egg->olev,(long)local_14,2,4,egg);
  return;
}

Assistant:

void attach_egg_hatch_timeout(struct obj *egg)
{
	int i;

	/* stop previous timer, if any */
	stop_timer(egg->olev, HATCH_EGG, egg);

	/*
	 * Decide if and when to hatch the egg.  The old hatch_it() code tried
	 * once a turn from age 151 to 200 (inclusive), hatching if it rolled
	 * a number x, 1<=x<=age, where x>150.  This yields a chance of
	 * hatching > 99.9993%.  Mimic that here.
	 */
	for (i = (MAX_EGG_HATCH_TIME-50)+1; i <= MAX_EGG_HATCH_TIME; i++)
	    if (rnd(i) > 150) {
		/* egg will hatch */
		start_timer(egg->olev, (long)i, TIMER_OBJECT,
						HATCH_EGG, egg);
		break;
	    }
}